

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_bitfield_insert_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,uint32_t op3,char *op,BaseType offset_count_type)

{
  AlignedBuffer<unsigned_int,_8UL> *pAVar1;
  AlignedBuffer<bool,_8UL> *pAVar2;
  BaseType BVar3;
  bool bVar4;
  SPIRType *pSVar5;
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  char (*ts_9) [2];
  string local_240;
  string local_220;
  string op3_expr;
  string op2_expr;
  string op1_expr;
  string op0_expr;
  SPIRType target_type;
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,op2);
  bVar4 = should_forward(this,op0);
  if (bVar4) {
    bVar4 = should_forward(this,op1);
    if (bVar4) {
      bVar4 = should_forward(this,op2);
      if (bVar4) {
        bVar4 = should_forward(this,op3);
        goto LAB_0033eb73;
      }
    }
  }
  bVar4 = false;
LAB_0033eb73:
  to_unpacked_expression_abi_cxx11_(&op0_expr,this,op0,true);
  to_unpacked_expression_abi_cxx11_(&op1_expr,this,op1,true);
  to_unpacked_expression_abi_cxx11_(&op2_expr,this,op2,true);
  to_unpacked_expression_abi_cxx11_(&op3_expr,this,op3,true);
  BVar3 = offset_count_type;
  if (offset_count_type - Int < 2) {
    pAVar1 = &target_type.array.stack_storage;
    target_type.super_IVariant.self.id = 0;
    target_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0050af18;
    target_type.columns = 1;
    target_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
    target_type.array.buffer_capacity = 8;
    pAVar2 = &target_type.array_size_literal.stack_storage;
    target_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
    target_type.array_size_literal.buffer_capacity = 8;
    target_type.pointer_depth = 0;
    target_type.pointer = false;
    target_type.forward_pointer = false;
    target_type.storage = Generic;
    target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
         (TypedID<(spirv_cross::Types)1> *)&target_type.member_types.stack_storage;
    target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
    buffer_size = 0;
    target_type.member_types.buffer_capacity = 8;
    target_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr =
         (uint *)&target_type.member_type_index_redirection.stack_storage;
    target_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
    target_type.member_type_index_redirection.buffer_capacity = 8;
    target_type.member_name_cache._M_h._M_buckets =
         &target_type.member_name_cache._M_h._M_single_bucket;
    target_type.image._0_7_ = 0;
    target_type.image._7_4_ = 0;
    target_type.parent_type.id = 0;
    target_type.image.sampled = 0;
    target_type.image.format = ImageFormatUnknown;
    target_type.image.access = AccessQualifierReadOnly;
    target_type.type_alias.id = 0;
    target_type.member_name_cache._M_h._M_bucket_count = 1;
    target_type.member_name_cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    target_type.member_name_cache._M_h._M_element_count = 0;
    target_type.member_name_cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    target_type.member_name_cache._M_h._M_rehash_policy._M_next_resize = 0;
    target_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
    target_type.width = 0x20;
    target_type.vecsize = 1;
    target_type.basetype = offset_count_type;
    target_type.super_IVariant._12_4_ = 0x15;
    target_type.array.super_VectorView<unsigned_int>.ptr = (uint *)pAVar1;
    target_type.array_size_literal.super_VectorView<bool>.ptr = (bool *)pAVar2;
    pSVar5 = Compiler::expression_type(&this->super_Compiler,op2);
    if (pSVar5->basetype != BVar3) {
      type_to_glsl_constructor_abi_cxx11_(&local_220,this,&target_type);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_240,(spirv_cross *)&local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40a721,
                 (char (*) [2])&op2_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x415df5,ts_3)
      ;
      ::std::__cxx11::string::operator=((string *)&op2_expr,(string *)&local_240);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
    }
    ts_9 = (char (*) [2])0x33ed62;
    pSVar5 = Compiler::expression_type(&this->super_Compiler,op3);
    if (pSVar5->basetype != BVar3) {
      type_to_glsl_constructor_abi_cxx11_(&local_220,this,&target_type);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_240,(spirv_cross *)&local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40a721,
                 (char (*) [2])&op3_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x415df5,ts_3)
      ;
      ts_9 = (char (*) [2])0x33edb4;
      ::std::__cxx11::string::operator=((string *)&op3_expr,(string *)&local_240);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        ts_9 = (char (*) [2])0x33edc7;
        operator_delete(local_240._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        ts_9 = (char (*) [2])0x33eddd;
        operator_delete(local_220._M_dataplus._M_p);
      }
    }
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_240,(spirv_cross *)&op,(char **)0x40a721,(char (*) [2])&op0_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x407185,
               (char (*) [3])&op1_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x407185,
               (char (*) [3])&op2_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x407185,
               (char (*) [3])&op3_expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x415df5,ts_9);
    emit_op(this,result_type,result_id,&local_240,bVar4,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p);
    }
    Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
    Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
    Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op2);
    Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op3);
    target_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0050af18;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&target_type.member_name_cache._M_h);
    target_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)
        target_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
        &target_type.member_type_index_redirection.stack_storage) {
      free(target_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
    }
    target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
    buffer_size = 0;
    if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
        target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
        != &target_type.member_types.stack_storage) {
      free(target_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
           ptr);
    }
    target_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
    if ((AlignedBuffer<bool,_8UL> *)target_type.array_size_literal.super_VectorView<bool>.ptr !=
        pAVar2) {
      free(target_type.array_size_literal.super_VectorView<bool>.ptr);
    }
    target_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)target_type.array.super_VectorView<unsigned_int>.ptr !=
        pAVar1) {
      free(target_type.array.super_VectorView<unsigned_int>.ptr);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)op3_expr._M_dataplus._M_p != &op3_expr.field_2) {
      operator_delete(op3_expr._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)op2_expr._M_dataplus._M_p != &op2_expr.field_2) {
      operator_delete(op2_expr._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)op1_expr._M_dataplus._M_p != &op1_expr.field_2) {
      operator_delete(op1_expr._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)op0_expr._M_dataplus._M_p != &op0_expr.field_2) {
      operator_delete(op0_expr._M_dataplus._M_p);
    }
    return;
  }
  __assert_fail("offset_count_type == SPIRType::UInt || offset_count_type == SPIRType::Int",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                ,0x1c40,
                "void spirv_cross::CompilerGLSL::emit_bitfield_insert_op(uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, const char *, SPIRType::BaseType)"
               );
}

Assistant:

void CompilerGLSL::emit_bitfield_insert_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                           uint32_t op2, uint32_t op3, const char *op,
                                           SPIRType::BaseType offset_count_type)
{
	// Only need to cast offset/count arguments. Types of base/insert must be same as result type,
	// and bitfieldInsert is sign invariant.
	bool forward = should_forward(op0) && should_forward(op1) && should_forward(op2) && should_forward(op3);

	auto op0_expr = to_unpacked_expression(op0);
	auto op1_expr = to_unpacked_expression(op1);
	auto op2_expr = to_unpacked_expression(op2);
	auto op3_expr = to_unpacked_expression(op3);

	assert(offset_count_type == SPIRType::UInt || offset_count_type == SPIRType::Int);
	SPIRType target_type { OpTypeInt };
	target_type.width = 32;
	target_type.vecsize = 1;
	target_type.basetype = offset_count_type;

	if (expression_type(op2).basetype != offset_count_type)
	{
		// Value-cast here. Input might be 16-bit. GLSL requires int.
		op2_expr = join(type_to_glsl_constructor(target_type), "(", op2_expr, ")");
	}

	if (expression_type(op3).basetype != offset_count_type)
	{
		// Value-cast here. Input might be 16-bit. GLSL requires int.
		op3_expr = join(type_to_glsl_constructor(target_type), "(", op3_expr, ")");
	}

	emit_op(result_type, result_id, join(op, "(", op0_expr, ", ", op1_expr, ", ", op2_expr, ", ", op3_expr, ")"),
	        forward);

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
	inherit_expression_dependencies(result_id, op2);
	inherit_expression_dependencies(result_id, op3);
}